

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_div_generator.cpp
# Opt level: O0

void generate_const_func<short>(void)

{
  ostream *poVar1;
  char *pcVar2;
  ostream *poVar3;
  function<void_(short)> *this;
  char param_name [2];
  long local_48;
  char local_2a [40];
  char local_2 [2];
  
  local_2[0] = 'v';
  local_2[1] = '\0';
  poVar1 = std::operator<<((ostream *)&std::cout,"LIBDIVIDE_INLINE constexpr ");
  pcVar2 = struct_selector<short>::get_name();
  poVar3 = std::operator<<(poVar1,pcVar2);
  this = (function<void_(short)> *)std::operator<<(poVar3," get_divider_");
  pcVar2 = type_tag<short>::get_tag();
  poVar3 = std::operator<<((ostream *)this,pcVar2);
  poVar3 = std::operator<<(poVar3,"(");
  pcVar2 = type_name<short>::get_name();
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,local_2);
  poVar3 = std::operator<<(poVar3,") {\n");
  std::operator<<(poVar3,"\treturn\n");
  local_48 = 0;
  do {
    local_2a[local_48] = local_2[local_48];
    local_48 = local_48 + 1;
  } while (local_48 != 2);
  std::function<void(short)>::function<generate_const_func<short>()::_lambda(short)_1_,void>
            (this,(anon_class_2_1_b878b4bb *)poVar1);
  generator<short>(this);
  std::function<void_(short)>::~function((function<void_(short)> *)0x10413b);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t");
  pcVar2 = struct_selector<short>::get_name();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," { 0, 0 }; // Unreachable\n");
  std::operator<<(poVar1,"}");
  return;
}

Assistant:

void generate_const_func() {
    const char param_name[] = "v";
    std::cout << "LIBDIVIDE_INLINE constexpr " << struct_selector<_IntT>::get_name()
                << " get_divider_" << type_tag<_IntT>::get_tag() 
                << "(" << type_name<_IntT>::get_name() << " " << param_name << ") {\n"
                << "\treturn\n";
    generator<_IntT>([param_name](_IntT denom) { 
            std::cout << "\t";
            generate_ternary_primary<_IntT>(denom, param_name); 
            });
    std:: cout  << "\t" << struct_selector<_IntT>::get_name() << " { 0, 0 }; // Unreachable\n"
                << "}";
}